

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmXcFrameworkPlist> * __thiscall
cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::BindPrivate
          (Object<cmXcFrameworkPlist> *this,string_view *name,MemberFunction *func,bool required)

{
  undefined1 auStack_68 [8];
  Member m;
  bool required_local;
  MemberFunction *func_local;
  string_view *name_local;
  Object<cmXcFrameworkPlist> *this_local;
  
  Member::Member((Member *)auStack_68);
  auStack_68 = (undefined1  [8])name->_M_len;
  m.Name._M_len = (size_t)name->_M_str;
  std::function<bool_(cmXcFrameworkPlist_&,_const_Json::Value_*,_cmJSONState_*)>::operator=
            ((function<bool_(cmXcFrameworkPlist_&,_const_Json::Value_*,_cmJSONState_*)> *)
             &m.Name._M_str,func);
  m.Function._M_invoker._0_1_ = required;
  std::
  vector<cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmXcFrameworkPlist>::Member>_>
  ::push_back(&this->Members,(Member *)auStack_68);
  if (required) {
    this->AnyRequired = true;
  }
  Member::~Member((Member *)auStack_68);
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }